

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_wiener_convolve_ssse3.c
# Opt level: O2

void av1_highbd_wiener_convolve_add_src_ssse3
               (uint8_t *src8,ptrdiff_t src_stride,uint8_t *dst8,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params,int bd)

{
  short sVar1;
  undefined2 *puVar9;
  ushort *puVar10;
  undefined2 *puVar11;
  undefined2 *puVar12;
  undefined2 *puVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  short sVar21;
  short sVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  char cVar30;
  byte bVar31;
  undefined4 uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  undefined4 uVar41;
  undefined1 auVar39 [12];
  undefined4 uVar42;
  undefined1 auVar40 [12];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  short local_8748;
  short sStack_8746;
  ushort auStack_8738 [128];
  undefined2 auStack_8638 [128];
  undefined1 auStack_8538 [256];
  undefined2 auStack_8438 [128];
  undefined1 auStack_8338 [256];
  undefined2 auStack_8238 [128];
  undefined1 auStack_8138 [256];
  undefined2 local_8038 [16388];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  
  lVar35 = (long)dst8 * 2;
  cVar30 = (char)conv_params->round_0;
  uVar32 = *(undefined4 *)filter_x;
  bVar31 = (byte)bd;
  auVar39._0_8_ = CONCAT26(filter_x[3] + 0x80,*(undefined6 *)filter_x);
  auVar39._8_2_ = filter_x[4];
  auVar39._10_2_ = filter_x[5];
  auVar43._12_2_ = filter_x[6];
  auVar43._0_12_ = auVar39;
  auVar43._14_2_ = filter_x[7];
  iVar37 = (1 << (bVar31 + 6 & 0x1f)) + (1 << (cVar30 - 1U & 0x1f));
  uVar41 = (undefined4)((ulong)auVar39._0_8_ >> 0x20);
  uVar42 = auVar39._8_4_;
  auVar47._12_4_ = auVar43._12_4_;
  auVar47._4_4_ = auVar47._12_4_;
  auVar47._0_4_ = auVar47._12_4_;
  auVar47._8_4_ = auVar47._12_4_;
  auVar43 = ZEXT416((uint)~(-1 << ((bVar31 - cVar30) + 8 & 0x1f)));
  auVar43 = pshuflw(auVar43,auVar43,0);
  uVar33 = 0;
  uVar34 = (ulong)(h + 7U);
  if ((int)(h + 7U) < 1) {
    uVar34 = uVar33;
  }
  lVar36 = (long)src8 * 2 + src_stride * -6 + 10;
  auVar45 = ZEXT416((uint)conv_params->round_0);
  for (; uVar33 != uVar34; uVar33 = uVar33 + 1) {
    for (lVar38 = 0; lVar38 < w; lVar38 = lVar38 + 8) {
      auVar49 = *(undefined1 (*) [16])(lVar36 + -0x10 + lVar38 * 2);
      auVar59 = *(undefined1 (*) [16])(lVar36 + lVar38 * 2);
      auVar14._16_16_ = auVar59;
      auVar14._0_16_ = auVar49;
      auVar15._16_16_ = auVar59;
      auVar15._0_16_ = auVar49;
      auVar27._4_4_ = uVar42;
      auVar27._0_4_ = uVar42;
      auVar27._8_4_ = uVar42;
      auVar27._12_4_ = uVar42;
      auVar58 = pmaddwd(auVar15._8_16_,auVar27);
      auVar16._16_16_ = auVar59;
      auVar16._0_16_ = auVar49;
      auVar70 = pmaddwd(auVar16._12_16_,auVar47);
      auVar17._16_16_ = auVar59;
      auVar17._0_16_ = auVar49;
      auVar18._16_16_ = auVar59;
      auVar18._0_16_ = auVar49;
      auVar19._16_16_ = auVar59;
      auVar19._0_16_ = auVar49;
      auVar23._4_4_ = uVar32;
      auVar23._0_4_ = uVar32;
      auVar23._8_4_ = uVar32;
      auVar23._12_4_ = uVar32;
      auVar68 = pmaddwd(auVar49,auVar23);
      auVar25._4_4_ = uVar41;
      auVar25._0_4_ = uVar41;
      auVar25._8_4_ = uVar41;
      auVar25._12_4_ = uVar41;
      auVar62 = pmaddwd(auVar14._4_16_,auVar25);
      auVar69._0_4_ =
           auVar68._0_4_ + iVar37 + auVar62._0_4_ + auVar70._0_4_ + auVar58._0_4_ >> auVar45;
      auVar69._4_4_ =
           auVar68._4_4_ + iVar37 + auVar62._4_4_ + auVar70._4_4_ + auVar58._4_4_ >> auVar45;
      auVar69._8_4_ =
           auVar68._8_4_ + iVar37 + auVar62._8_4_ + auVar70._8_4_ + auVar58._8_4_ >> auVar45;
      auVar69._12_4_ =
           auVar68._12_4_ + iVar37 + auVar62._12_4_ + auVar70._12_4_ + auVar58._12_4_ >> auVar45;
      auVar20._16_16_ = auVar59;
      auVar20._0_16_ = auVar49;
      auVar24._4_4_ = uVar32;
      auVar24._0_4_ = uVar32;
      auVar24._8_4_ = uVar32;
      auVar24._12_4_ = uVar32;
      auVar59 = pmaddwd(auVar17._2_16_,auVar24);
      auVar26._4_4_ = uVar41;
      auVar26._0_4_ = uVar41;
      auVar26._8_4_ = uVar41;
      auVar26._12_4_ = uVar41;
      auVar58 = pmaddwd(auVar18._6_16_,auVar26);
      auVar28._4_4_ = uVar42;
      auVar28._0_4_ = uVar42;
      auVar28._8_4_ = uVar42;
      auVar28._12_4_ = uVar42;
      auVar62 = pmaddwd(auVar19._10_16_,auVar28);
      auVar49 = pmaddwd(auVar20._14_16_,auVar47);
      auVar60._0_4_ =
           auVar59._0_4_ + iVar37 + auVar62._0_4_ + auVar58._0_4_ + auVar49._0_4_ >> auVar45;
      auVar60._4_4_ =
           auVar59._4_4_ + iVar37 + auVar62._4_4_ + auVar58._4_4_ + auVar49._4_4_ >> auVar45;
      auVar60._8_4_ =
           auVar59._8_4_ + iVar37 + auVar62._8_4_ + auVar58._8_4_ + auVar49._8_4_ >> auVar45;
      auVar60._12_4_ =
           auVar59._12_4_ + iVar37 + auVar62._12_4_ + auVar58._12_4_ + auVar49._12_4_ >> auVar45;
      auVar49 = packssdw(auVar69,auVar60);
      sVar1 = (ushort)(-1 < auVar49._0_2_) * auVar49._0_2_;
      sVar2 = (ushort)(-1 < auVar49._2_2_) * auVar49._2_2_;
      sVar3 = (ushort)(-1 < auVar49._4_2_) * auVar49._4_2_;
      sVar4 = (ushort)(-1 < auVar49._6_2_) * auVar49._6_2_;
      sVar5 = (ushort)(-1 < auVar49._8_2_) * auVar49._8_2_;
      sVar6 = (ushort)(-1 < auVar49._10_2_) * auVar49._10_2_;
      sVar7 = (ushort)(-1 < auVar49._12_2_) * auVar49._12_2_;
      sVar8 = (ushort)(-1 < auVar49._14_2_) * auVar49._14_2_;
      sVar21 = auVar43._0_2_;
      sVar22 = auVar43._2_2_;
      puVar10 = auStack_8738 + (ulong)((uint)uVar33 & 0x1ffffff) * 0x80 + lVar38;
      *puVar10 = (ushort)(sVar21 < sVar1) * sVar21 | (ushort)(sVar21 >= sVar1) * sVar1;
      puVar10[1] = (ushort)(sVar22 < sVar2) * sVar22 | (ushort)(sVar22 >= sVar2) * sVar2;
      puVar10[2] = (ushort)(sVar21 < sVar3) * sVar21 | (ushort)(sVar21 >= sVar3) * sVar3;
      puVar10[3] = (ushort)(sVar22 < sVar4) * sVar22 | (ushort)(sVar22 >= sVar4) * sVar4;
      puVar10[4] = (ushort)(sVar21 < sVar5) * sVar21 | (ushort)(sVar21 >= sVar5) * sVar5;
      puVar10[5] = (ushort)(sVar22 < sVar6) * sVar22 | (ushort)(sVar22 >= sVar6) * sVar6;
      puVar10[6] = (ushort)(sVar21 < sVar7) * sVar21 | (ushort)(sVar21 >= sVar7) * sVar7;
      puVar10[7] = (ushort)(sVar22 < sVar8) * sVar22 | (ushort)(sVar22 >= sVar8) * sVar8;
    }
    lVar36 = lVar36 + src_stride * 2;
  }
  cVar30 = (char)conv_params->round_1;
  uVar32 = *(undefined4 *)filter_y;
  auVar40._0_8_ = CONCAT26(filter_y[3] + 0x80,*(undefined6 *)filter_y);
  auVar40._8_2_ = filter_y[4];
  auVar40._10_2_ = filter_y[5];
  auVar45._12_2_ = filter_y[6];
  auVar45._0_12_ = auVar40;
  auVar45._14_2_ = filter_y[7];
  iVar37 = (-1 << ((cVar30 + bVar31) - 1 & 0x1f)) + (1 << (cVar30 - 1U & 0x1f));
  uVar41 = (undefined4)((ulong)auVar40._0_8_ >> 0x20);
  uVar42 = auVar40._8_4_;
  auVar49._12_4_ = auVar45._12_4_;
  auVar49._4_4_ = auVar49._12_4_;
  auVar49._0_4_ = auVar49._12_4_;
  auVar49._8_4_ = auVar49._12_4_;
  auVar43 = ZEXT416((uint)~(-1 << (bVar31 & 0x1f)));
  auVar43 = pshuflw(auVar43,auVar43,0);
  uVar34 = 0;
  if (h < 1) {
    h = 0;
  }
  for (; uVar34 != (uint)h; uVar34 = uVar34 + 1) {
    uVar33 = (ulong)((uint)uVar34 & 0x1ffffff);
    lVar36 = uVar33 * 0x100;
    for (lVar38 = 0; lVar38 < w; lVar38 = lVar38 + 8) {
      auVar47 = *(undefined1 (*) [16])(auStack_8738 + uVar33 * 0x80 + lVar38);
      puVar11 = auStack_8638 + uVar33 * 0x80 + lVar38;
      auVar45 = *(undefined1 (*) [16])(auStack_8538 + lVar38 * 2 + lVar36);
      auVar51._0_12_ = auVar47._0_12_;
      auVar51._12_2_ = auVar47._6_2_;
      auVar51._14_2_ = puVar11[3];
      auVar50._12_4_ = auVar51._12_4_;
      auVar50._0_10_ = auVar47._0_10_;
      auVar50._10_2_ = puVar11[2];
      auVar75._10_6_ = auVar50._10_6_;
      auVar75._0_8_ = auVar47._0_8_;
      auVar75._8_2_ = auVar47._4_2_;
      auVar67._8_8_ = auVar75._8_8_;
      auVar67._6_2_ = puVar11[1];
      auVar67._4_2_ = auVar47._2_2_;
      auVar67._0_2_ = auVar47._0_2_;
      auVar67._2_2_ = *puVar11;
      puVar12 = auStack_8438 + uVar33 * 0x80 + lVar38;
      auVar74._0_12_ = auVar45._0_12_;
      auVar74._12_2_ = auVar45._6_2_;
      auVar74._14_2_ = puVar12[3];
      auVar73._12_4_ = auVar74._12_4_;
      auVar73._0_10_ = auVar45._0_10_;
      auVar73._10_2_ = puVar12[2];
      auVar72._10_6_ = auVar73._10_6_;
      auVar72._0_8_ = auVar45._0_8_;
      auVar72._8_2_ = auVar45._4_2_;
      auVar71._8_8_ = auVar72._8_8_;
      auVar71._6_2_ = puVar12[1];
      auVar71._4_2_ = auVar45._2_2_;
      auVar71._0_2_ = auVar45._0_2_;
      auVar71._2_2_ = *puVar12;
      auVar59 = *(undefined1 (*) [16])(auStack_8338 + lVar38 * 2 + lVar36);
      puVar13 = auStack_8238 + uVar33 * 0x80 + lVar38;
      auVar66._0_12_ = auVar59._0_12_;
      auVar66._12_2_ = auVar59._6_2_;
      auVar66._14_2_ = puVar13[3];
      auVar65._12_4_ = auVar66._12_4_;
      auVar65._0_10_ = auVar59._0_10_;
      auVar65._10_2_ = puVar13[2];
      auVar64._10_6_ = auVar65._10_6_;
      auVar64._0_8_ = auVar59._0_8_;
      auVar64._8_2_ = auVar59._4_2_;
      auVar63._8_8_ = auVar64._8_8_;
      auVar63._6_2_ = puVar13[1];
      auVar63._4_2_ = auVar59._2_2_;
      auVar63._0_2_ = auVar59._0_2_;
      auVar63._2_2_ = *puVar13;
      auVar58 = *(undefined1 (*) [16])(auStack_8138 + lVar38 * 2 + lVar36);
      puVar9 = local_8038 + uVar33 * 0x80 + lVar38;
      auVar62._4_4_ = uVar32;
      auVar62._0_4_ = uVar32;
      auVar62._8_4_ = uVar32;
      auVar62._12_4_ = uVar32;
      auVar62 = pmaddwd(auVar67,auVar62);
      auVar68._4_4_ = uVar41;
      auVar68._0_4_ = uVar41;
      auVar68._8_4_ = uVar41;
      auVar68._12_4_ = uVar41;
      auVar75 = pmaddwd(auVar71,auVar68);
      auVar55._0_12_ = auVar58._0_12_;
      auVar55._12_2_ = auVar58._6_2_;
      auVar55._14_2_ = puVar9[3];
      auVar54._12_4_ = auVar55._12_4_;
      auVar54._0_10_ = auVar58._0_10_;
      auVar54._10_2_ = puVar9[2];
      auVar53._10_6_ = auVar54._10_6_;
      auVar53._0_8_ = auVar58._0_8_;
      auVar53._8_2_ = auVar58._4_2_;
      auVar52._8_8_ = auVar53._8_8_;
      auVar52._6_2_ = puVar9[1];
      auVar52._4_2_ = auVar58._2_2_;
      auVar52._0_2_ = auVar58._0_2_;
      auVar52._2_2_ = *puVar9;
      auVar70._4_4_ = uVar42;
      auVar70._0_4_ = uVar42;
      auVar70._8_4_ = uVar42;
      auVar70._12_4_ = uVar42;
      auVar67 = pmaddwd(auVar63,auVar70);
      auVar68 = pmaddwd(auVar52,auVar49);
      auVar57._2_2_ = puVar11[4];
      auVar57._0_2_ = auVar47._8_2_;
      auVar57._4_2_ = auVar47._10_2_;
      auVar57._6_2_ = puVar11[5];
      auVar57._8_2_ = auVar47._12_2_;
      auVar57._10_2_ = puVar11[6];
      auVar57._12_2_ = auVar47._14_2_;
      auVar57._14_2_ = puVar11[7];
      auVar48._2_2_ = puVar12[4];
      auVar48._0_2_ = auVar45._8_2_;
      auVar48._4_2_ = auVar45._10_2_;
      auVar48._6_2_ = puVar12[5];
      auVar48._8_2_ = auVar45._12_2_;
      auVar48._10_2_ = puVar12[6];
      auVar48._12_2_ = auVar45._14_2_;
      auVar48._14_2_ = puVar12[7];
      auVar46._2_2_ = puVar13[4];
      auVar46._0_2_ = auVar59._8_2_;
      auVar46._4_2_ = auVar59._10_2_;
      auVar46._6_2_ = puVar13[5];
      auVar46._8_2_ = auVar59._12_2_;
      auVar46._10_2_ = puVar13[6];
      auVar46._12_2_ = auVar59._14_2_;
      auVar46._14_2_ = puVar13[7];
      auVar61._2_2_ = puVar9[4];
      auVar61._0_2_ = auVar58._8_2_;
      auVar61._4_2_ = auVar58._10_2_;
      auVar61._6_2_ = puVar9[5];
      auVar61._8_2_ = auVar58._12_2_;
      auVar61._10_2_ = puVar9[6];
      auVar61._12_2_ = auVar58._14_2_;
      auVar61._14_2_ = puVar9[7];
      auVar59._4_4_ = uVar32;
      auVar59._0_4_ = uVar32;
      auVar59._8_4_ = uVar32;
      auVar59._12_4_ = uVar32;
      auVar70 = pmaddwd(auVar57,auVar59);
      auVar58._4_4_ = uVar41;
      auVar58._0_4_ = uVar41;
      auVar58._8_4_ = uVar41;
      auVar58._12_4_ = uVar41;
      auVar59 = pmaddwd(auVar48,auVar58);
      auVar29._4_4_ = uVar42;
      auVar29._0_4_ = uVar42;
      auVar29._8_4_ = uVar42;
      auVar29._12_4_ = uVar42;
      auVar47 = pmaddwd(auVar46,auVar29);
      auVar58 = pmaddwd(auVar61,auVar49);
      auVar45 = ZEXT416((uint)conv_params->round_1);
      auVar44._0_4_ =
           auVar68._0_4_ + auVar67._0_4_ + auVar75._0_4_ + auVar62._0_4_ + iVar37 >> auVar45;
      auVar44._4_4_ =
           auVar58._0_4_ + auVar47._0_4_ + auVar59._0_4_ + auVar70._0_4_ + iVar37 >> auVar45;
      auVar44._8_4_ =
           auVar68._4_4_ + auVar67._4_4_ + auVar75._4_4_ + auVar62._4_4_ + iVar37 >> auVar45;
      auVar44._12_4_ =
           auVar58._4_4_ + auVar47._4_4_ + auVar59._4_4_ + auVar70._4_4_ + iVar37 >> auVar45;
      auVar56._0_4_ =
           auVar68._8_4_ + auVar67._8_4_ + auVar75._8_4_ + auVar62._8_4_ + iVar37 >> auVar45;
      auVar56._4_4_ =
           auVar58._8_4_ + auVar47._8_4_ + auVar59._8_4_ + auVar70._8_4_ + iVar37 >> auVar45;
      auVar56._8_4_ =
           auVar68._12_4_ + auVar67._12_4_ + auVar75._12_4_ + auVar62._12_4_ + iVar37 >> auVar45;
      auVar56._12_4_ =
           auVar58._12_4_ + auVar47._12_4_ + auVar59._12_4_ + auVar70._12_4_ + iVar37 >> auVar45;
      auVar47 = packssdw(auVar44,auVar56);
      sVar2 = (ushort)(-1 < auVar47._0_2_) * auVar47._0_2_;
      sVar1 = (ushort)(-1 < auVar47._2_2_) * auVar47._2_2_;
      sVar3 = (ushort)(-1 < auVar47._4_2_) * auVar47._4_2_;
      sVar4 = (ushort)(-1 < auVar47._6_2_) * auVar47._6_2_;
      sVar5 = (ushort)(-1 < auVar47._8_2_) * auVar47._8_2_;
      sVar6 = (ushort)(-1 < auVar47._10_2_) * auVar47._10_2_;
      sVar7 = (ushort)(-1 < auVar47._12_2_) * auVar47._12_2_;
      sVar8 = (ushort)(-1 < auVar47._14_2_) * auVar47._14_2_;
      local_8748 = auVar43._0_2_;
      sStack_8746 = auVar43._2_2_;
      puVar10 = (ushort *)(lVar35 + lVar38 * 2);
      *puVar10 = (ushort)(local_8748 < sVar2) * local_8748 | (ushort)(local_8748 >= sVar2) * sVar2;
      puVar10[1] = (ushort)(sStack_8746 < sVar1) * sStack_8746 |
                   (ushort)(sStack_8746 >= sVar1) * sVar1;
      puVar10[2] = (ushort)(local_8748 < sVar3) * local_8748 | (ushort)(local_8748 >= sVar3) * sVar3
      ;
      puVar10[3] = (ushort)(sStack_8746 < sVar4) * sStack_8746 |
                   (ushort)(sStack_8746 >= sVar4) * sVar4;
      puVar10[4] = (ushort)(local_8748 < sVar5) * local_8748 | (ushort)(local_8748 >= sVar5) * sVar5
      ;
      puVar10[5] = (ushort)(sStack_8746 < sVar6) * sStack_8746 |
                   (ushort)(sStack_8746 >= sVar6) * sVar6;
      puVar10[6] = (ushort)(local_8748 < sVar7) * local_8748 | (ushort)(local_8748 >= sVar7) * sVar7
      ;
      puVar10[7] = (ushort)(sStack_8746 < sVar8) * sStack_8746 |
                   (ushort)(sStack_8746 >= sVar8) * sVar8;
    }
    lVar35 = lVar35 + dst_stride * 2;
  }
  return;
}

Assistant:

void av1_highbd_wiener_convolve_add_src_ssse3(
    const uint8_t *src8, ptrdiff_t src_stride, uint8_t *dst8,
    ptrdiff_t dst_stride, const int16_t *filter_x, int x_step_q4,
    const int16_t *filter_y, int y_step_q4, int w, int h,
    const WienerConvolveParams *conv_params, int bd) {
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  assert(bd + FILTER_BITS - conv_params->round_0 + 2 <= 16);
  (void)x_step_q4;
  (void)y_step_q4;

  const uint16_t *const src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *const dst = CONVERT_TO_SHORTPTR(dst8);

  DECLARE_ALIGNED(16, uint16_t,
                  temp[(MAX_SB_SIZE + SUBPEL_TAPS - 1) * MAX_SB_SIZE]);
  int intermediate_height = h + SUBPEL_TAPS - 1;
  int i, j;
  const int center_tap = ((SUBPEL_TAPS - 1) / 2);
  const uint16_t *const src_ptr = src - center_tap * src_stride - center_tap;

  const __m128i zero = _mm_setzero_si128();
  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i offset = _mm_insert_epi16(zero, 1 << FILTER_BITS, 3);

  /* Horizontal filter */
  {
    const __m128i coeffs_x =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_x), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        (1 << (conv_params->round_0 - 1)) + (1 << (bd + FILTER_BITS - 1)));

    for (i = 0; i < intermediate_height; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
        const __m128i data2 =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j + 8]);

        // Filter even-index pixels
        const __m128i res_0 = _mm_madd_epi16(data, coeff_01);
        const __m128i res_2 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 4), coeff_23);
        const __m128i res_4 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 8), coeff_45);
        const __m128i res_6 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 12), coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even = _mm_srai_epi32(_mm_add_epi32(res_even, round_const),
                                  conv_params->round_0);

        // Filter odd-index pixels
        const __m128i res_1 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 2), coeff_01);
        const __m128i res_3 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 6), coeff_23);
        const __m128i res_5 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 10), coeff_45);
        const __m128i res_7 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 14), coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd = _mm_srai_epi32(_mm_add_epi32(res_odd, round_const),
                                 conv_params->round_0);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        const __m128i maxval =
            _mm_set1_epi16((WIENER_CLAMP_LIMIT(conv_params->round_0, bd)) - 1);
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        res = _mm_min_epi16(_mm_max_epi16(res, zero), maxval);
        _mm_storeu_si128((__m128i *)&temp[i * MAX_SB_SIZE + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const __m128i coeffs_y =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_y), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const =
        _mm_set1_epi32((1 << (conv_params->round_1 - 1)) -
                       (1 << (bd + conv_params->round_1 - 1)));

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const uint16_t *data = &temp[i * MAX_SB_SIZE + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round = _mm_srai_epi32(
            _mm_add_epi32(res_lo, round_const), conv_params->round_1);
        const __m128i res_hi_round = _mm_srai_epi32(
            _mm_add_epi32(res_hi, round_const), conv_params->round_1);

        const __m128i maxval = _mm_set1_epi16((1 << bd) - 1);
        __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
        res_16bit = _mm_min_epi16(_mm_max_epi16(res_16bit, zero), maxval);

        __m128i *const p = (__m128i *)&dst[i * dst_stride + j];
        _mm_storeu_si128(p, res_16bit);
      }
    }
  }
}